

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase394::run(TestCase394 *this)

{
  bool bVar1;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:399:7)>
  TVar2;
  char *begin;
  char *end;
  bool local_91;
  undefined1 local_90 [7];
  bool _kj_shouldLog_1;
  int local_78;
  bool local_71;
  int *piStack_70;
  bool _kj_shouldLog;
  int *i;
  Maybe<int> local_58;
  Maybe<int> result;
  Input input;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
  local_25;
  undefined1 local_21;
  undefined1 local_20 [3];
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:399:7)>
  parser;
  StringPtr text;
  TestCase394 *this_local;
  
  StringPtr::StringPtr((StringPtr *)local_20,"foo");
  input.best._5_1_ = 0x66;
  input.best._6_1_ = exactly<char>((char *)((long)&input.best + 5));
  input.best._3_1_ = 0x6f;
  input.best._4_1_ = exactly<char>((char *)((long)&input.best + 3));
  input.best._1_1_ = 0x6f;
  input.best._2_1_ = exactly<char>((char *)((long)&input.best + 1));
  register0x00000000 =
       sequence<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>
                 ((Exactly_<char> *)((long)&input.best + 6),
                  (Exactly_<char> *)((long)&input.best + 4),
                  (Exactly_<char> *)((long)&input.best + 2));
  TVar2 = transformWithLocation<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase394::run()::__0>
                    ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
                      *)((long)&input.best + 7),(Type *)&input.best);
  local_25 = TVar2.subParser;
  local_21 = TVar2._4_1_;
  begin = StringPtr::begin((StringPtr *)local_20);
  end = StringPtr::end((StringPtr *)local_20);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result,begin,end);
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:399:7)>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((TransformWithLocation_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:399:7)>
              *)&local_58,(IteratorInput<char,_const_char_*> *)&local_25);
  piStack_70 = kj::_::readMaybe<int>(&local_58);
  if (piStack_70 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x19a);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_90,(char (*) [24])"Expected 123, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_90);
  }
  else if (*piStack_70 != 0x7b) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_78 = 0x7b;
      kj::_::Debug::log<char_const(&)[31],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x198,ERROR,"\"failed: expected \" \"(123) == (*i)\", 123, *i",
                 (char (*) [31])"failed: expected (123) == (*i)",&local_78,piStack_70);
      local_71 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)&result);
  if (!bVar1) {
    local_91 = kj::_::Debug::shouldLog(ERROR);
    while (local_91 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_91 = false;
    }
  }
  Maybe<int>::~Maybe(&local_58);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)&result);
  return;
}

Assistant:

TEST(CommonParsers, TransformParser) {
  StringPtr text = "foo";

  auto parser = transformWithLocation(
      sequence(exactly('f'), exactly('o'), exactly('o')),
      [](Span<const char*> location) -> int {
        EXPECT_EQ("foo", StringPtr(location.begin(), location.end()));
        return 123;
      });

  {
    Input input(text.begin(), text.end());
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(123, *i);
    } else {
      ADD_FAILURE() << "Expected 123, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }